

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

void crnlib::image_utils::renorm_normal_map(image_u8 *img)

{
  byte bVar1;
  color_quad<unsigned_char,_int> cVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  uint i;
  long lVar4;
  uint in_ECX;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte bVar11;
  float fVar9;
  float fVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char cVar14;
  byte bVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  byte bVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  undefined8 local_68;
  float local_60;
  uint local_5c;
  float local_58 [4];
  char local_48;
  char cStack_47;
  byte bStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  if (img->m_height != 0) {
    cVar14 = -0x80;
    bVar15 = 0x80;
    cVar17 = '\0';
    cVar18 = '\0';
    cVar20 = '\0';
    cVar21 = '\0';
    cVar23 = '\0';
    cVar24 = '\0';
    uVar6 = 0;
    local_48 = -0x80;
    cStack_47 = -0x80;
    bStack_46 = 0x80;
    bStack_45 = 0x80;
    cStack_44 = '\0';
    cStack_43 = '\0';
    cStack_42 = '\0';
    cStack_41 = '\0';
    cStack_40 = '\0';
    cStack_3f = '\0';
    cStack_3e = '\0';
    cStack_3d = '\0';
    cStack_3c = '\0';
    cStack_3b = '\0';
    cStack_3a = '\0';
    cStack_39 = '\0';
    cVar16 = cVar14;
    bVar19 = bVar15;
    cVar22 = cVar17;
    cVar25 = cVar18;
    cVar26 = cVar20;
    cVar27 = cVar21;
    cVar28 = cVar23;
    cVar29 = cVar24;
    do {
      if (img->m_width != 0) {
        uVar8 = 0;
        local_5c = uVar6;
        do {
          pcVar3 = img->m_pPixels;
          uVar7 = img->m_pitch * uVar6 + uVar8;
          cVar2.field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
               *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                &pcVar3[uVar7].field_0.field_0;
          bVar11 = cVar2.field_0._1_1_;
          auVar12[0] = -(cVar2.field_0._0_1_ == cVar14);
          auVar12[1] = -(cVar2.field_0._0_1_ == cVar16);
          auVar12[2] = -(bVar11 == bVar15);
          auVar12[3] = -(bVar11 == bVar19);
          auVar12[4] = -(cVar2.field_0._2_1_ == cVar17);
          auVar12[5] = -(cVar2.field_0._2_1_ == cVar22);
          auVar12[6] = -(cVar2.field_0._3_1_ == cVar18);
          auVar12[7] = -(cVar2.field_0._3_1_ == cVar25);
          auVar12[8] = -(cVar20 == '\0');
          auVar12[9] = -(cVar26 == '\0');
          auVar12[10] = -(cVar21 == '\0');
          auVar12[0xb] = -(cVar27 == '\0');
          auVar12[0xc] = -(cVar23 == '\0');
          auVar12[0xd] = -(cVar28 == '\0');
          auVar12[0xe] = -(cVar24 == '\0');
          auVar12[0xf] = -(cVar29 == '\0');
          auVar12 = pshuflw(auVar12,auVar12,0x50);
          auVar13._0_4_ = auVar12._0_4_;
          auVar13._4_4_ = auVar13._0_4_;
          auVar13._8_4_ = auVar12._4_4_;
          auVar13._12_4_ = auVar12._4_4_;
          uVar5 = movmskpd(in_ECX,auVar13);
          in_ECX = uVar5 ^ 3;
          bVar1 = pcVar3[uVar7].field_0.field_0.b;
          if (bVar1 != 0x80 || (char)in_ECX != '\0') {
            local_68 = CONCAT44((float)bVar11,(float)((uint)cVar2.field_0 & 0xff));
            local_60 = (float)bVar1;
            lVar4 = 0;
            do {
              *(float *)((long)&local_68 + lVar4 * 4) =
                   *(float *)((long)&local_68 + lVar4 * 4) * 0.003921569;
              lVar4 = lVar4 + 1;
            } while (lVar4 != 3);
            lVar4 = 0;
            do {
              fVar9 = *(float *)((long)&local_68 + lVar4 * 4);
              *(float *)((long)&local_68 + lVar4 * 4) = fVar9 + fVar9;
              lVar4 = lVar4 + 1;
            } while (lVar4 != 3);
            local_58[0] = 1.0;
            local_58[1] = 1.0;
            local_58[2] = 1.0;
            lVar4 = 0;
            do {
              *(float *)((long)&local_68 + lVar4 * 4) =
                   *(float *)((long)&local_68 + lVar4 * 4) - local_58[lVar4];
              lVar4 = lVar4 + 1;
            } while (lVar4 != 3);
            lVar4 = 0;
            do {
              fVar9 = *(float *)((long)&local_68 + lVar4 * 4);
              fVar10 = 1.0;
              if (fVar9 <= 1.0) {
                fVar10 = fVar9;
              }
              *(uint *)((long)&local_68 + lVar4 * 4) =
                   -(uint)(fVar9 < -1.0) & 0xbf800000 | ~-(uint)(fVar9 < -1.0) & (uint)fVar10;
              lVar4 = lVar4 + 1;
            } while (lVar4 != 3);
            fVar9 = (float)local_68 * (float)local_68;
            lVar4 = 1;
            do {
              fVar10 = *(float *)((long)&local_68 + lVar4 * 4);
              fVar9 = fVar9 + fVar10 * fVar10;
              lVar4 = lVar4 + 1;
            } while (lVar4 != 3);
            if (fVar9 < 0.0) {
              fVar9 = sqrtf(fVar9);
              cVar14 = local_48;
              cVar16 = cStack_47;
              bVar15 = bStack_46;
              bVar19 = bStack_45;
              cVar17 = cStack_44;
              cVar22 = cStack_43;
              cVar18 = cStack_42;
              cVar25 = cStack_41;
              cVar20 = cStack_40;
              cVar26 = cStack_3f;
              cVar21 = cStack_3e;
              cVar27 = cStack_3d;
              cVar23 = cStack_3c;
              cVar28 = cStack_3b;
              cVar24 = cStack_3a;
              cVar29 = cStack_39;
            }
            else {
              fVar9 = SQRT(fVar9);
            }
            if (0.077 <= fVar9) {
              if (0.077 < ABS(fVar9 + -1.0)) {
                lVar4 = 0;
                do {
                  *(float *)((long)&local_68 + lVar4 * 4) =
                       *(float *)((long)&local_68 + lVar4 * 4) / fVar9;
                  lVar4 = lVar4 + 1;
                } while (lVar4 != 3);
                lVar4 = 0;
                do {
                  fVar10 = floorf((*(float *)((long)&local_68 + lVar4 * 4) + 1.0) * 0.5 * 255.0 +
                                  0.5);
                  fVar9 = 255.0;
                  if (fVar10 <= 255.0) {
                    fVar9 = fVar10;
                  }
                  pcVar3[uVar7].field_0.c[lVar4] =
                       (uchar)(int)(float)(~-(uint)(fVar10 < 0.0) & (uint)fVar9);
                  lVar4 = lVar4 + 1;
                  uVar6 = local_5c;
                  cVar14 = local_48;
                  cVar16 = cStack_47;
                  bVar15 = bStack_46;
                  bVar19 = bStack_45;
                  cVar17 = cStack_44;
                  cVar22 = cStack_43;
                  cVar18 = cStack_42;
                  cVar25 = cStack_41;
                  cVar20 = cStack_40;
                  cVar26 = cStack_3f;
                  cVar21 = cStack_3e;
                  cVar27 = cStack_3d;
                  cVar23 = cStack_3c;
                  cVar28 = cStack_3b;
                  cVar24 = cStack_3a;
                  cVar29 = cStack_39;
                } while (lVar4 != 3);
              }
            }
            else {
              *(undefined2 *)&pcVar3[uVar7].field_0 = 0x8080;
              pcVar3[uVar7].field_0.field_0.b = 0x80;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < img->m_width);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < img->m_height);
  }
  return;
}

Assistant:

void renorm_normal_map(image_u8& img) {
  for (uint y = 0; y < img.get_height(); y++) {
    for (uint x = 0; x < img.get_width(); x++) {
      color_quad_u8& c = img(x, y);
      if ((c.r == 128) && (c.g == 128) && (c.b == 128))
        continue;

      vec3F v(c.r, c.g, c.b);
      v *= 1.0f / 255.0f;
      v *= 2.0f;
      v -= vec3F(1.0f);
      v.clamp(-1.0f, 1.0f);

      float length = v.length();
      if (length < .077f)
        c.set(128, 128, 128, c.a);
      else if (fabs(length - 1.0f) > .077f) {
        if (length)
          v /= length;

        for (uint i = 0; i < 3; i++)
          c[i] = static_cast<uint8>(math::clamp<float>(floor((v[i] + 1.0f) * .5f * 255.0f + .5f), 0.0f, 255.0f));

        if ((c.r == 128) && (c.g == 128)) {
          if (c.b < 128)
            c.b = 0;
          else
            c.b = 255;
        }
      }
    }
  }
}